

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

void __thiscall Entity::setRotation(Entity *this,float rotation)

{
  if (270.0 < rotation) {
    do {
      rotation = rotation + -360.0;
    } while (270.0 < rotation);
  }
  for (; rotation < 0.0; rotation = rotation + 360.0) {
  }
  this->rotation = (int)rotation;
  return;
}

Assistant:

void Entity::setRotation(float rotation) {
    float actualRotation = rotation;
    while (actualRotation > 270) {
        actualRotation -= 360;
    }
    while (actualRotation < 0) {
        actualRotation += 360;
    }
    this->rotation = actualRotation;
}